

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O1

void seq_print(uint32_t *script,uint32_t len,rnndeccontext *ctx,rnndomain *mmiodom)

{
  seq_op *psVar1;
  uint uVar2;
  rnndecaddrinfo *prVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar4 = 0;
  while (uVar4 < len) {
    uVar2 = script[uVar4];
    if (0x3c < (uVar2 & 0xffff)) {
      return;
    }
    if (uVar2 + 0xfc000000 < 0xfc010000) {
      return;
    }
    uVar4 = (uVar2 >> 0x10) + uVar4;
    if (len < uVar4) {
      return;
    }
  }
  printf("SEQ script, size: %uB\n",(ulong)(len * 4));
  if (len == 0) {
    return;
  }
  uVar7 = 0;
  do {
    uVar12 = (uint)uVar7;
    uVar4 = script[uVar7];
    uVar2 = uVar4 & 0xffff;
    uVar7 = (ulong)uVar2;
    if (0x3c < uVar2) {
      pcVar5 = "%06x: Invalid op\n";
LAB_0024eb86:
      printf(pcVar5,(ulong)(uVar12 << 2));
      return;
    }
    uVar13 = uVar4 >> 0x10;
    pcVar5 = (char *)(uVar7 * 3);
    if (uVar13 < seq_ops[uVar7].min_size) {
      pcVar5 = "%06x: Opcode size too small\n";
      goto LAB_0024eb86;
    }
    psVar1 = seq_ops + uVar7;
    if (0x3c < uVar2) {
switchD_0024e542_caseD_10:
      printf("%06x: %-14s\n",(ulong)(uVar12 * 4),psVar1->txt,pcVar5);
      goto LAB_0024ea96;
    }
    pcVar5 = "";
    switch(uVar2) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      pcVar5 = "reg_last";
      if ((uVar4 & 1) == 0) {
        pcVar5 = "val_last";
      }
      printf("%06x: %-14s%s      %s 0x%08x\n",(ulong)(uVar12 * 4),psVar1->txt,pcVar5,
             seq_ops[uVar2 >> 1].binop,(ulong)script[uVar12 + 1]);
      break;
    case 10:
    case 0xc:
      pcVar5 = "reg_last+";
    case 0xb:
      uVar7 = 0;
      if (uVar2 - 0xb < 2) {
        uVar7 = (ulong)script[uVar12 + 1];
      }
      uVar8 = (ulong)(uVar12 * 4);
      pcVar10 = psVar1->txt;
      pcVar9 = "%06x: %-14sval_last   :=  R[%s0x%06x]\n";
      goto LAB_0024e752;
    case 0xd:
    case 0xe:
    case 0xf:
      pcVar5 = "";
      if ((uVar4 & 0xfffd) == 0xd) {
        pcVar5 = "reg_last+";
      }
      uVar7 = 0;
      if ((uVar4 & 0xfffe) == 0xe) {
        uVar7 = (ulong)script[uVar12 + 1];
      }
      uVar8 = (ulong)(uVar12 * 4);
      pcVar10 = psVar1->txt;
      pcVar9 = "%06x: %-14sR[%s0x%06x]   :=  val_last\n";
      goto LAB_0024e752;
    default:
      goto switchD_0024e542_caseD_10;
    case 0x13:
    case 0x2e:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar10 = "%06x: %-14s%u ns\n";
      goto LAB_0024ea2e;
    case 0x14:
      uVar4 = script[uVar12 + 1] & 0xffff;
      if (uVar4 < 0x101) {
        if (uVar4 == 0) {
          pcVar5 = "HEAD0_VBLANK";
        }
        else if (uVar4 == 1) {
          pcVar5 = "HEAD1_VBLANK";
        }
        else if (uVar4 == 0x100) {
          pcVar5 = "HEAD0_HBLANK";
        }
        else {
LAB_0024eaf1:
          printf("%06x: Invalid param %08x for op 0x14\n",(ulong)(uVar12 * 4),
                 (ulong)script[uVar12 + 1],"");
          pcVar5 = "(unknown)   ";
        }
      }
      else if (uVar4 == 0x101) {
        pcVar5 = "HEAD1_HBLANK";
      }
      else if (uVar4 == 0x300) {
        pcVar5 = "FB_PAUSED   ";
      }
      else {
        if (uVar4 != 0x400) goto LAB_0024eaf1;
        pcVar5 = "PGRAPH_IDLE ";
      }
      if ((*(byte *)((long)script + (ulong)(uVar12 + 1) * 4 + 2) & 1) == 0) {
        pcVar10 = "%06x: %-14s%s  , %u ns\n";
      }
      else {
        pcVar10 = "%06x: %-14s!%s , %u ns\n";
      }
      printf(pcVar10,(ulong)(uVar12 * 4),psVar1->txt,pcVar5,(ulong)script[uVar12 + 2]);
      break;
    case 0x15:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      uVar11 = (ulong)script[uVar12 + 2];
      pcVar10 = "%06x: %-14sR[last_reg] & 0x%08x == val_last, %u ns\n";
      goto LAB_0024ea8c;
    case 0x17:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar10 = "%06x: %-14sval_last, %08x\n";
      goto LAB_0024ea2e;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)(script[uVar12 + 1] << 2);
      pcVar10 = "%06x: %-14s0x%06x\n";
      goto LAB_0024ea2e;
    case 0x1f:
    case 0x2c:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar10 = psVar1->txt;
      pcVar5 = seq_ops[uVar7].binop;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar9 = "%06x: %-14sval_last      %s R[0x%06x]\n";
      goto LAB_0024e752;
    case 0x20:
      if (script[uVar12 + 1] == 1) {
        pcVar5 = "%06x: FB PAUSE\n";
      }
      else {
        pcVar5 = "%06x: FB RESUME\n";
      }
      printf(pcVar5,(ulong)(uVar12 * 4),
             (long)&switchD_0024e542::switchdataD_00255544 +
             (long)(int)(&switchD_0024e542::switchdataD_00255544)[uVar2],"");
      break;
    case 0x21:
      printf("%06x: SET REGISTERS:\n",(ulong)(uVar12 * 4),
             (long)&switchD_0024e542::switchdataD_00255544 +
             (long)(int)(&switchD_0024e542::switchdataD_00255544)[uVar2],"");
      uVar7 = 1;
      if (0x1ffff < uVar4) {
        uVar2 = uVar12 * 4 + 4;
        uVar7 = 1;
        uVar4 = uVar12;
        do {
          prVar3 = rnndec_decodeaddr(ctx,mmiodom,(ulong)script[uVar4 + 1],1);
          printf("%06x:               R[0x%06x]   :=  0x%08x     # %s\n",(ulong)uVar2,
                 (ulong)script[uVar4 + 1],(ulong)script[uVar4 + 2],prVar3->name);
          uVar7 = uVar7 + 2;
          uVar2 = uVar2 + 8;
          uVar4 = uVar4 + 2;
        } while (uVar7 < uVar13);
      }
      iVar6 = (int)uVar7;
      uVar4 = (iVar6 + uVar12) * 4 - 8;
      printf("%06x:               reg_last      :=  0x%08x\n",(ulong)uVar4,
             (ulong)script[(iVar6 + uVar12) - 2]);
      printf("%06x:               val_last      :=  0x%08x\n",(ulong)uVar4,
             (ulong)script[(iVar6 + uVar12) - 1]);
      break;
    case 0x22:
    case 0x30:
    case 0x32:
      uVar4 = script[uVar12 + 1];
      pcVar5 = psVar1->txt;
      pcVar10 = seq_ops[uVar7].binop;
      pcVar9 = "%06x: %-14sOUT[0x%x]      %s val_last\n";
      goto LAB_0024e678;
    case 0x23:
    case 0x31:
    case 0x33:
      uVar4 = script[uVar12 + 1];
      pcVar5 = psVar1->txt;
      pcVar10 = seq_ops[uVar7].binop;
      pcVar9 = "%06x: %-14sOUT[OUT[0x%x]] %s val_last\n";
LAB_0024e678:
      printf(pcVar9,(ulong)(uVar12 * 4),pcVar5,(ulong)uVar4,pcVar10);
      break;
    case 0x24:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      uVar11 = (ulong)script[uVar12 + 2];
      pcVar10 = "%06x: %-14sOUT[0x%x]      :=  %08x\n";
      goto LAB_0024ea8c;
    case 0x25:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      uVar11 = (ulong)script[uVar12 + 2];
      pcVar10 = "%06x: %-14sOUT[OUT[0x%x]] :=  %08x\n";
      goto LAB_0024ea8c;
    case 0x26:
    case 0x3b:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar10 = psVar1->txt;
      pcVar5 = seq_ops[uVar7].binop;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar9 = "%06x: %-14sval_last      %s OUT[0x%x]\n";
      goto LAB_0024e752;
    case 0x27:
    case 0x3c:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar10 = psVar1->txt;
      pcVar5 = seq_ops[uVar7].binop;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar9 = "%06x: %-14sval_last      %s OUT[OUT[0x%x]]\n";
LAB_0024e752:
      printf(pcVar9,uVar8,pcVar10,pcVar5,uVar7);
      break;
    case 0x28:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar10 = "%06x: %-14sreg_last      :=  OUT[0x%x]\n";
      goto LAB_0024ea2e;
    case 0x29:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar10 = "%06x: %-14sreg_last      :=  OUT[OUT[0x%x]]\n";
      goto LAB_0024ea2e;
    case 0x2a:
      printf("%06x: %-14sOUT[0x%x]      +=  0x%08x (%d)\n",(ulong)(uVar12 * 4),psVar1->txt,
             (ulong)script[uVar12 + 1],(ulong)script[uVar12 + 2],(ulong)script[uVar12 + 2]);
      break;
    case 0x2b:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      uVar11 = (ulong)script[uVar12 + 2];
      pcVar10 = "%06x: %-14sOUT[0x%x], 0x%08x\n";
      goto LAB_0024ea8c;
    case 0x2d:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      uVar11 = (ulong)script[uVar12 + 2];
      pcVar10 = "%06x: %-14sHEAD%d HEAD%d\n";
LAB_0024ea8c:
      printf(pcVar10,uVar8,pcVar5,uVar7,uVar11);
      break;
    case 0x34:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar10 = "%06x: %-14sOUT[0x%x]\n";
      goto LAB_0024ea2e;
    case 0x35:
      uVar8 = (ulong)(uVar12 * 4);
      pcVar5 = psVar1->txt;
      uVar7 = (ulong)script[uVar12 + 1];
      pcVar10 = "%06x: %-14sOUT[OUT[0x%x]]\n";
LAB_0024ea2e:
      printf(pcVar10,uVar8,pcVar5,uVar7);
    }
LAB_0024ea96:
    uVar7 = (ulong)(uVar13 + uVar12);
    if (len <= uVar13 + uVar12) {
      return;
    }
  } while( true );
}

Assistant:

void
seq_print(uint32_t *script, uint32_t len, struct rnndeccontext *ctx, struct rnndomain *mmiodom)
{
	unsigned int pc, op, size;
	char *reg0;
	unsigned int reg1, i;
	const char *wait_op;

	/* Validate script, bail if invalid */
	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c || size > 0x3ff || size == 0)
			return;

		if(pc + size > len)
			return;
	}

	printf("SEQ script, size: %uB\n", len << 2);

	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c) {
			seq_out(pc,"Invalid op\n");
			return;
		}

		if(seq_ops[op].min_size > size){
			seq_out(pc,"Opcode size too small\n");
			return;
		}

		switch(op) {
		case 0x0:
		case 0x1:
		case 0x2:
		case 0x3:
		case 0x4:
		case 0x5:
		case 0x6:
		case 0x7:
		case 0x8:
		case 0x9:
			seq_outlast(pc,op,script[pc+1]);
			break;
		case 0xa:
		case 0xb:
		case 0xc:
			reg0 = "";
			reg1 = 0;

			if(op == 0xa || op == 0x0c) {
			        reg0 = "reg_last+";
			}

			if (op == 0xb || op == 0xc) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"val_last   :=  R[%s0x%06x]\n",reg0,reg1);
			break;
		case 0xd:
		case 0xe:
		case 0xf:
			reg0 = "";
			reg1 = 0;

			if(op == 0xd || op == 0xf) {
			        reg0 = "reg_last+";
			}

			if (op == 0xe || op == 0xf) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"R[%s0x%06x]   :=  val_last\n",reg0,reg1);
			break;
		case 0x13:
		case 0x2e:
			seq_out_op(pc,op,"%u ns\n",script[pc+1]);
			break;
		case 0x14:
			//seq_out_op(pc,op,"%s, %u ns\n",seq_wait_status[script[pc+1] & 0xff],script[pc+2]);
			switch(script[pc+1] & 0xffff) {
			case 0x0:
				wait_op = "HEAD0_VBLANK";
				break;
			case 0x1:
				wait_op = "HEAD1_VBLANK";
				break;
			case 0x100:
				wait_op = "HEAD0_HBLANK";
				break;
			case 0x101:
				wait_op = "HEAD1_HBLANK";
				break;
			case 0x300:
				wait_op = "FB_PAUSED   ";
				break;
			case 0x400:
				wait_op = "PGRAPH_IDLE ";
				break;
			default:
				wait_op = "(unknown)   ";
				seq_out(pc,"Invalid param %08x for op 0x14\n", script[pc+1]);
			}

			if(script[pc+1] & 0x10000) {
				seq_out_op(pc,op,"!%s , %u ns\n",wait_op,script[pc+2]);
			} else {
				seq_out_op(pc,op,"%s  , %u ns\n",wait_op,script[pc+2]);
			}
			break;
		case 0x15:
			seq_out_op(pc,op,"R[last_reg] & 0x%08x == val_last, %u ns\n",script[pc+1],script[pc+2]);
			break;
		case 0x16:
			seq_out_op(pc,op,"\n");
			break;
		case 0x17:
			seq_out_op(pc,op,"val_last, %08x\n", script[pc+1]);
			break;
		case 0x18:
		case 0x19:
		case 0x1a:
		case 0x1b:
		case 0x1c:
			seq_out_op(pc,op,"0x%06x\n", script[pc+1] << 2);
			break;
		case 0x1d:
		case 0x1e:
			seq_out_op(pc,op,"\n");
			break;
		case 0x1f:
		case 0x2c:
			seq_out_op(pc,op,"val_last      %s R[0x%06x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x20:
			if(script[pc+1] == 1)
				seq_out(pc,"FB PAUSE\n");
			else
				seq_out(pc,"FB RESUME\n");
			break;
		case 0x21:
			seq_out(pc,"SET REGISTERS:\n");
			for (i = 1; i < size; i += 2) {
				struct rnndecaddrinfo *ai = rnndec_decodeaddr(ctx, mmiodom, script[pc+i], 1);
				seq_out(pc+i,"              R[0x%06x]   :=  0x%08x     # %s\n", script[pc+i], script[pc+i+1], ai->name);
			}
			seq_out(pc+i-2,"              reg_last      :=  0x%08x\n", script[pc+i-2]);
			seq_out(pc+i-2,"              val_last      :=  0x%08x\n", script[pc+i-1]);
			break;
		case 0x22:
		case 0x30:
		case 0x32:
			seq_out_op(pc,op,"OUT[0x%x]      %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x23:
		case 0x31:
		case 0x33:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x24:
			seq_out_op(pc,op,"OUT[0x%x]      :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x25:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x26:
		case 0x3b:
			seq_out_op(pc,op,"val_last      %s OUT[0x%x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x27:
		case 0x3c:
			seq_out_op(pc,op,"val_last      %s OUT[OUT[0x%x]]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x28:
			seq_out_op(pc,op,"reg_last      :=  OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x29:
			seq_out_op(pc,op,"reg_last      :=  OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		case 0x2a:
			seq_out_op(pc,op,"OUT[0x%x]      +=  0x%08x (%d)\n", script[pc+1], script[pc+2], script[pc+2]);
			break;
		case 0x2b:
			seq_out_op(pc,op,"OUT[0x%x], 0x%08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x2d:
			seq_out_op(pc,op,"HEAD%d HEAD%d\n", script[pc+1], script[pc+2]);
			break;
		case 0x34:
			seq_out_op(pc,op,"OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x35:
			seq_out_op(pc,op,"OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		default:
			seq_out_op(pc,op,"\n");
			break;
		}
	}
}